

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
_set_selector<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,5>,Eigen::Matrix<double,_1,1,0,_1,1>,4>>
          (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this,
          GeneralProduct<Eigen::GeneralProduct<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
          *other,true_type *param_3)

{
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RDI;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  DenseBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_5>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>_>
  *in_stack_ffffffffffffffc8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_28 [2];
  
  this_00 = local_28;
  DenseBase<Eigen::GeneralProduct<Eigen::GeneralProduct<Eigen::ReturnByValue<Eigen::internal::inverse_impl<Eigen::GeneralProduct<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_5>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_4>_>
  ::eval(in_stack_ffffffffffffffc8);
  _set_noalias<Eigen::Matrix<double,_1,1,0,_1,1>>(this_00,in_RDI);
  Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2de2fa);
  return;
}

Assistant:

EIGEN_STRONG_INLINE void _set_selector(const OtherDerived& other, const internal::true_type&) { _set_noalias(other.eval()); }